

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestVariables::Run(ParserTestVariables *this)

{
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "l = one-letter-test\nrule link\n  command = ld $l $extra $with_under -o $out $in\n\nextra = -pthread\nwith_under = -under\nbuild a: link b c\nnested1 = 1\nnested2 = $nested1/2\nbuild supernested: link x\n  extra = $nested2/3\n"
            );
  if (iVar1 == g_current_test->assertion_failures_) {
    bVar3 = testing::Test::Check
                      (g_current_test,
                       (long)(this->super_ParserTest).state.edges_.
                             super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->super_ParserTest).state.edges_.
                             super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                             super__Vector_impl_data._M_start == 0x10,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0xa0,"2u == state.edges_.size()");
    pTVar2 = g_current_test;
    if (bVar3) {
      Edge::EvaluateCommand_abi_cxx11_
                (&local_68,
                 *(this->super_ParserTest).state.edges_.
                  super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                  super__Vector_impl_data._M_start,false);
      bVar3 = std::operator==("ld one-letter-test -pthread -under -o a b c",&local_68);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0xa3,"\"ld one-letter-test -pthread -under -o a b c\" == edge->EvaluateCommand()")
      ;
      std::__cxx11::string::~string((string *)&local_68);
      pTVar2 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"nested2",&local_69);
      BindingEnv::LookupVariable(&local_68,&(this->super_ParserTest).state.bindings_,&local_48);
      bVar3 = std::operator==("1/2",&local_68);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0xa4,"\"1/2\" == state.bindings_.LookupVariable(\"nested2\")");
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
      pTVar2 = g_current_test;
      Edge::EvaluateCommand_abi_cxx11_
                (&local_68,
                 (this->super_ParserTest).state.edges_.
                 super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data
                 ._M_start[1],false);
      bVar3 = std::operator==("ld one-letter-test 1/2/3 -under -o supernested x",&local_68);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0xa8,
                 "\"ld one-letter-test 1/2/3 -under -o supernested x\" == edge->EvaluateCommand()");
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, Variables) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"l = one-letter-test\n"
"rule link\n"
"  command = ld $l $extra $with_under -o $out $in\n"
"\n"
"extra = -pthread\n"
"with_under = -under\n"
"build a: link b c\n"
"nested1 = 1\n"
"nested2 = $nested1/2\n"
"build supernested: link x\n"
"  extra = $nested2/3\n"));

  ASSERT_EQ(2u, state.edges_.size());
  Edge* edge = state.edges_[0];
  EXPECT_EQ("ld one-letter-test -pthread -under -o a b c",
            edge->EvaluateCommand());
  EXPECT_EQ("1/2", state.bindings_.LookupVariable("nested2"));

  edge = state.edges_[1];
  EXPECT_EQ("ld one-letter-test 1/2/3 -under -o supernested x",
            edge->EvaluateCommand());
}